

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

FPinfo * amrex::FabArrayBase::TheFPinfo
                   (FabArrayBase *srcfa,FabArrayBase *dstfa,IntVect *dstng,BoxConverter *coarsener,
                   Geometry *fgeom,Geometry *cgeom,IndexSpace *index_space)

{
  bool bVar1;
  Box *pBVar2;
  pointer pBVar3;
  pointer ppVar4;
  FPinfo *pFVar5;
  CacheStats *this;
  byte bVar6;
  undefined8 *in_RCX;
  int *in_RDX;
  FabArrayBase *in_RSI;
  Geometry *in_R8;
  Geometry *in_R9;
  const_iterator in_stack_00000008;
  FPinfo *new_fpc;
  FPinfoCacheIter it;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  er_it;
  BDKey *dstkey;
  BDKey *srckey;
  int i;
  Box dstdomain;
  int off;
  uint bitval;
  uint typ;
  int dir;
  BoxConverter *in_stack_00000240;
  IntVect *in_stack_00000248;
  Box *in_stack_00000250;
  FabArrayBase *in_stack_00000258;
  FabArrayBase *in_stack_00000260;
  FPinfo *in_stack_00000268;
  Box *in_stack_000005c0;
  Box *in_stack_000005c8;
  IndexSpace *in_stack_000005d0;
  BoxArray *in_stack_fffffffffffffd28;
  multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  *in_stack_fffffffffffffd30;
  BDKey *in_stack_fffffffffffffd38;
  FabArrayBase *in_stack_fffffffffffffd40;
  bool local_269;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*> local_250;
  _Base_ptr local_238;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*> local_230;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_218 [3];
  FPinfo *local_200;
  Box local_1f8;
  Box local_1dc;
  uint local_1c0;
  uint local_1bc;
  _Self local_1b8;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  local_1b0;
  BDKey local_1a0;
  BDKey *local_190;
  BDKey local_188;
  BDKey *local_178;
  int local_16c;
  uint local_168;
  Box local_164;
  Geometry *local_148;
  Geometry *local_140;
  undefined8 *local_138;
  int *local_130;
  FabArrayBase *local_128;
  int *local_110;
  IntVect *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  int local_cc;
  int *local_c8;
  int local_c0;
  uint local_bc;
  uint local_b8;
  int local_b4;
  Box *local_b0;
  uint local_a4;
  uint *local_a0;
  uint *local_98;
  int local_8c;
  IndexType *local_88;
  int local_7c;
  uint *local_78;
  int local_6c;
  uint *local_68;
  int local_5c;
  IndexType *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  IntVect *local_40;
  uint local_38;
  int local_34;
  IndexType *local_30;
  int local_24;
  IndexType *local_20;
  int local_18;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  local_148 = in_R9;
  local_140 = in_R8;
  local_138 = in_RCX;
  local_130 = in_RDX;
  local_128 = in_RSI;
  pBVar2 = Geometry::Domain(in_R8);
  local_164.smallend.vect._0_8_ = *(undefined8 *)(pBVar2->smallend).vect;
  local_164._8_8_ = *(undefined8 *)((pBVar2->smallend).vect + 2);
  local_164.bigend.vect._4_8_ = *(undefined8 *)((pBVar2->bigend).vect + 1);
  local_164.btype.itype = (pBVar2->btype).itype;
  boxArray(local_128);
  local_168 = (uint)BoxArray::ixType(in_stack_fffffffffffffd28);
  local_b0 = &local_164;
  for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
    local_78 = &local_a4;
    local_7c = local_b4;
    local_6c = local_b4;
    local_4c = local_b4;
    bVar6 = (byte)local_b4;
    local_b8 = (uint)((local_168 & 1 << (bVar6 & 0x1f)) != 0);
    local_88 = &local_164.btype;
    local_8c = local_b4;
    local_5c = local_b4;
    local_50 = local_b4;
    local_bc = (uint)((local_164.btype.itype & 1 << (bVar6 & 0x1f)) != 0);
    local_c0 = local_b8 - local_bc;
    local_40 = &local_164.bigend;
    local_44 = local_b4;
    local_40->vect[local_b4] = local_c0 + local_40->vect[local_b4];
    local_30 = &local_164.btype;
    local_34 = local_b4;
    if (local_b8 == 0) {
      local_24 = local_b4;
      local_18 = local_b4;
      local_164.btype.itype = (1 << (bVar6 & 0x1f) ^ 0xffffffffU) & local_164.btype.itype;
      local_20 = local_30;
    }
    else {
      local_14 = local_b4;
      local_4 = local_b4;
      local_164.btype.itype = 1 << (bVar6 & 0x1f) | local_164.btype.itype;
      local_10 = local_30;
    }
    local_68 = local_78;
    local_58 = local_88;
    local_48 = local_c0;
    local_38 = local_b8;
  }
  local_a4 = local_168;
  for (local_16c = 0; local_16c < 3; local_16c = local_16c + 1) {
    bVar1 = Geometry::isPeriodic(local_140,local_16c);
    if (bVar1) {
      local_c8 = local_130;
      local_cc = local_16c;
      Box::grow(&local_164,local_16c,local_130[local_16c]);
    }
  }
  local_188 = getBDKey(in_stack_fffffffffffffd40);
  local_178 = &local_188;
  local_1a0 = getBDKey(in_stack_fffffffffffffd40);
  local_190 = &local_1a0;
  local_1b0 = std::
              multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
              ::equal_range(in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
  local_1b8._M_node = local_1b0.first._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_1b8,&local_1b0.second);
    if (!bVar1) {
      pFVar5 = (FPinfo *)operator_new(0x148);
      pBVar2 = Geometry::Domain(local_140);
      this = (CacheStats *)Geometry::Domain(local_148);
      FPinfo::FPinfo(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
                     in_stack_00000248,in_stack_00000240,in_stack_000005c0,in_stack_000005c8,
                     in_stack_000005d0);
      pFVar5->m_nuse = 1;
      local_200 = pFVar5;
      CacheStats::recordBuild(this);
      CacheStats::recordUse((CacheStats *)m_FPinfo_stats);
      std::
      _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
      ::_Rb_tree_const_iterator(local_218,&local_1b0.second);
      std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>::
      pair<amrex::FabArrayBase::FPinfo_*&,_true>(&local_230,local_190,&local_200);
      local_238 = (_Base_ptr)
                  std::
                  multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                  ::insert((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                            *)this,in_stack_00000008,(value_type *)pBVar2);
      bVar1 = BDKey::operator!=((BDKey *)in_stack_fffffffffffffd40,
                                (BDKey *)in_stack_00000008._M_node);
      if (bVar1) {
        std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>::
        pair<amrex::FabArrayBase::FPinfo_*&,_true>(&local_250,local_178,&local_200);
        std::
        multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
        ::insert((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                  *)pBVar2,(value_type *)0x12ad450);
      }
      return local_200;
    }
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>::
    operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                *)0x12acfc4);
    bVar1 = BDKey::operator==((BDKey *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_269 = false;
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                    *)0x12acffb);
      bVar1 = BDKey::operator==((BDKey *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_269 = false;
      if (bVar1) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                               *)0x12ad032);
        bVar1 = Box::operator==(&ppVar4->second->m_dstdomain,&local_164);
        local_269 = false;
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                                 *)0x12ad069);
          pFVar5 = ppVar4->second;
          local_108 = &pFVar5->m_dstng;
          local_110 = local_130;
          local_d8 = local_130;
          local_dc = 0;
          bVar1 = false;
          if (local_108->vect[0] == *local_130) {
            local_e8 = local_130;
            local_ec = 1;
            bVar1 = false;
            if ((pFVar5->m_dstng).vect[1] == local_130[1]) {
              local_f8 = local_130;
              local_fc = 2;
              bVar1 = (pFVar5->m_dstng).vect[2] == local_130[2];
            }
          }
          local_269 = false;
          if (bVar1) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                                   *)0x12ad16d);
            local_1bc = (uint)Box::ixType(&ppVar4->second->m_dstdomain);
            local_1c0 = (uint)Box::ixType(&local_164);
            local_98 = &local_1bc;
            local_a0 = &local_1c0;
            local_269 = false;
            if (local_1c0 == local_1bc) {
              std::
              _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                            *)0x12ad1e5);
              pBVar3 = std::
                       unique_ptr<amrex::BoxConverter,_std::default_delete<amrex::BoxConverter>_>::
                       operator->((unique_ptr<amrex::BoxConverter,_std::default_delete<amrex::BoxConverter>_>
                                   *)0x12ad1f5);
              ppVar4 = std::
                       _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                       ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                                     *)0x12ad207);
              (**pBVar3->_vptr_BoxConverter)(&local_1dc,pBVar3,&ppVar4->second->m_dstdomain);
              (**(code **)*local_138)(&local_1f8,local_138,&local_164);
              local_269 = Box::operator==(&local_1dc,&local_1f8);
            }
          }
        }
      }
    }
    if (local_269 != false) break;
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>::
    operator++((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                *)in_stack_fffffffffffffd30);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                         *)0x12ad271);
  ppVar4->second->m_nuse = ppVar4->second->m_nuse + 1;
  CacheStats::recordUse((CacheStats *)m_FPinfo_stats);
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                         *)0x12ad2a0);
  return ppVar4->second;
}

Assistant:

const FabArrayBase::FPinfo&
FabArrayBase::TheFPinfo (const FabArrayBase& srcfa,
                         const FabArrayBase& dstfa,
                         const IntVect&      dstng,
                         const BoxConverter& coarsener,
                         const Geometry&     fgeom,
                         const Geometry&     cgeom,
                         const EB2::IndexSpace* index_space)
{
    BL_PROFILE("FabArrayBase::TheFPinfo()");

    Box dstdomain = fgeom.Domain();
    dstdomain.convert(dstfa.boxArray().ixType());
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            dstdomain.grow(i,dstng[i]);
        }
    }

    const BDKey& srckey = srcfa.getBDKey();
    const BDKey& dstkey = dstfa.getBDKey();

    std::pair<FPinfoCacheIter,FPinfoCacheIter> er_it = m_TheFillPatchCache.equal_range(dstkey);

    for (FPinfoCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_srcbdk    == srckey    &&
            it->second->m_dstbdk    == dstkey    &&
            it->second->m_dstdomain == dstdomain &&
            it->second->m_dstng     == dstng     &&
            it->second->m_dstdomain.ixType() == dstdomain.ixType() &&
            it->second->m_coarsener->doit(it->second->m_dstdomain) == coarsener.doit(dstdomain))
        {
            ++(it->second->m_nuse);
            m_FPinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    FPinfo* new_fpc = new FPinfo(srcfa, dstfa, dstdomain, dstng, coarsener,
                                 fgeom.Domain(), cgeom.Domain(), index_space);

#ifdef AMREX_MEM_PROFILING
    m_FPinfo_stats.bytes += new_fpc->bytes();
    m_FPinfo_stats.bytes_hwm = std::max(m_FPinfo_stats.bytes_hwm, m_FPinfo_stats.bytes);
#endif

    new_fpc->m_nuse = 1;
    m_FPinfo_stats.recordBuild();
    m_FPinfo_stats.recordUse();

    m_TheFillPatchCache.insert(er_it.second, FPinfoCache::value_type(dstkey,new_fpc));
    if (srckey != dstkey)
        m_TheFillPatchCache.insert(          FPinfoCache::value_type(srckey,new_fpc));

    return *new_fpc;
}